

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void __thiscall VCFilter::VCFilter(VCFilter *this)

{
  VCCLCompilerTool *in_RDI;
  
  QString::QString((QString *)0x27259c);
  QString::QString((QString *)0x2725aa);
  QString::QString((QString *)0x2725b8);
  *(undefined4 *)&(in_RDI->AdditionalUsingDirectories).d.size = 0xffffffff;
  (((QStringList *)&in_RDI->AssemblerListingLocation)->d).ptr = (QString *)0x0;
  QList<VCFilterFile>::QList((QList<VCFilterFile> *)0x2725d5);
  VCCustomBuildTool::VCCustomBuildTool((VCCustomBuildTool *)in_RDI);
  VCCLCompilerTool::VCCLCompilerTool(in_RDI);
  *(undefined1 *)&(in_RDI->BrowseInformationFile).d.d = 0;
  *(undefined1 *)&(in_RDI->ForcedUsingFiles).d.size = 0;
  return;
}

Assistant:

VCFilter::VCFilter()
    :   ParseFiles(unset),
        Config(nullptr)
{
    useCustomBuildTool = false;
    useCompilerTool = false;
}